

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ClockingSkew __thiscall
slang::ast::ClockingBlockSymbol::getDefaultInputSkew(ClockingBlockSymbol *this)

{
  bool bVar1;
  Scope *context_00;
  ClockingSkew *pCVar3;
  Symbol *in_RDI;
  LookupLocation LVar4;
  ClockingSkew CVar5;
  ASTContext context;
  Scope *scope;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff70;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff78;
  Symbol *syntax;
  Scope *pSVar2;
  
  syntax = in_RDI;
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::ClockingSkew> *)0x3a5978);
  if (!bVar1) {
    if (*(long *)&in_RDI[2].indexInScope == 0) {
      std::optional<slang::ast::ClockingSkew>::emplace<>
                ((optional<slang::ast::ClockingSkew> *)in_RDI);
    }
    else {
      context_00 = Symbol::getParentScope(in_RDI);
      LVar4 = LookupLocation::before(in_RDI);
      pSVar2 = LVar4.scope;
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff78,None);
      LVar4._8_8_ = pSVar2;
      LVar4.scope = (Scope *)in_stack_ffffffffffffff78.m_bits;
      ASTContext::ASTContext
                ((ASTContext *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (Scope *)in_RDI,LVar4,in_stack_ffffffffffffff70);
      CVar5 = ClockingSkew::fromSyntax((ClockingSkewSyntax *)syntax,(ASTContext *)context_00);
      std::optional<slang::ast::ClockingSkew>::operator=
                ((optional<slang::ast::ClockingSkew> *)CVar5.delay,
                 (ClockingSkew *)CONCAT44(in_stack_ffffffffffffff6c,CVar5.edge));
    }
  }
  pCVar3 = std::optional<slang::ast::ClockingSkew>::operator*
                     ((optional<slang::ast::ClockingSkew> *)0x3a5a5a);
  CVar5._0_8_ = *(ulong *)pCVar3 & 0xffffffff;
  CVar5.delay = pCVar3->delay;
  return CVar5;
}

Assistant:

ClockingSkew ClockingBlockSymbol::getDefaultInputSkew() const {
    if (!defaultInputSkew) {
        if (inputSkewSyntax) {
            auto scope = getParentScope();
            SLANG_ASSERT(scope);

            ASTContext context(*scope, LookupLocation::before(*this));
            defaultInputSkew = ClockingSkew::fromSyntax(*inputSkewSyntax, context);
        }
        else {
            defaultInputSkew.emplace();
        }
    }
    return *defaultInputSkew;
}